

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

QWidget * findDnDTarget(QWidget *parent,QPoint *pos)

{
  bool bVar1;
  QPoint *in_RSI;
  QWidget *in_RDI;
  QWidget *widget;
  uint7 in_stack_ffffffffffffffe0;
  byte bVar2;
  QWidget *local_18;
  
  local_18 = QWidget::childAt(in_RDI,in_RSI);
  if (local_18 == (QWidget *)0x0) {
    local_18 = in_RDI;
  }
  while( true ) {
    bVar2 = 0;
    if (local_18 != (QWidget *)0x0) {
      bVar1 = QWidget::isWindow((QWidget *)(ulong)in_stack_ffffffffffffffe0);
      bVar2 = 0;
      if (!bVar1) {
        bVar1 = QWidget::acceptDrops((QWidget *)0x3b8005);
        bVar2 = bVar1 ^ 0xff;
      }
    }
    if ((bVar2 & 1) == 0) break;
    local_18 = QWidget::parentWidget((QWidget *)0x3b8021);
  }
  if ((local_18 != (QWidget *)0x0) && (bVar1 = QWidget::acceptDrops((QWidget *)0x3b803a), !bVar1)) {
    local_18 = (QWidget *)0x0;
  }
  return local_18;
}

Assistant:

static QWidget *findDnDTarget(QWidget *parent, const QPoint &pos)
{
    // Find a target widget under mouse that accepts drops (QTBUG-22987).
    QWidget *widget = parent->childAt(pos);
    if (!widget)
        widget = parent;
    for ( ; widget && !widget->isWindow() && !widget->acceptDrops(); widget = widget->parentWidget()) ;
    if (widget && !widget->acceptDrops())
        widget = nullptr;
    return widget;
}